

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.hpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::LazyResource
          (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *this,
          MovePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *resource)

{
  PtrData<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> data;
  int iVar1;
  deBool dVar2;
  Resource *pRVar3;
  ulong uVar4;
  ulong __new_size;
  InternalError *this_00;
  Resource *in_stack_ffffffffffffff78;
  size_t numPages;
  size_t numElements;
  size_t resSize;
  MovePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *resource_local;
  LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *this_local;
  
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)resource,
             (MovePtr *)resource);
  data._8_8_ = resource;
  data.ptr = in_stack_ffffffffffffff78;
  de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::UniquePtr
            (&this->m_resource,data);
  std::
  vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ::vector(&this->m_elements);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->m_isPageResident);
  pRVar3 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     ((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)this);
  iVar1 = (*pRVar3->_vptr_Resource[3])();
  uVar4 = (ulong)iVar1;
  __new_size = uVar4 >> 3;
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 && (__new_size << 3 == uVar4))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      std::
      vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
      ::resize(&this->m_elements,__new_size);
      std::vector<bool,_std::allocator<bool>_>::resize
                (&this->m_isPageResident,
                 (uVar4 >> 0xd) + (long)(int)(uint)((__new_size & 0x3ff) != 0),false);
      return;
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,"numElements*sizeof(Element) == resSize",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.hpp"
             ,0x87);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

LazyResource<Element>::LazyResource (de::MovePtr<tcu::Resource> resource)
	: m_resource(resource)
{
	const size_t	resSize		= m_resource->getSize();
	const size_t	numElements	= resSize/sizeof(Element);
	const size_t	numPages	= (numElements >> ELEMENTS_PER_PAGE_LOG2) + ((numElements & ((1u<<ELEMENTS_PER_PAGE_LOG2)-1u)) == 0 ? 0 : 1);

	TCU_CHECK_INTERNAL(numElements*sizeof(Element) == resSize);

	m_elements.resize(numElements);
	m_isPageResident.resize(numPages, false);
}